

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int ffi_pairs(lua_State *L,MMS mm)

{
  TValue *pTVar1;
  ushort uVar2;
  uint uVar3;
  uint32_t uVar4;
  TValue *pTVar5;
  TValue *pTVar6;
  cTValue *pcVar7;
  GCstr *pGVar8;
  GCstr *name;
  CTState *cts;
  TValue *base;
  uint id;
  TValue *top;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
  cts->L = L;
  pTVar5 = L->base;
  pTVar6 = L->top;
  if ((pTVar6 <= pTVar5) || ((pTVar5->field_2).it != 0xfffffff5)) {
    lj_err_argt(L,1,10);
  }
  uVar2 = *(ushort *)((ulong)(pTVar5->u32).lo + 6);
  uVar3 = cts->tab[uVar2].info;
  id = (uint)uVar2;
  if ((uVar3 & 0xf0000000) == 0x20000000) {
    id = uVar3 & 0xffff;
  }
  pcVar7 = lj_ctype_meta(cts,id,mm);
  if (pcVar7 == (cTValue *)0x0) {
    pGVar8 = lj_ctype_repr(L,id,name);
    lj_err_callerv(L,LJ_ERR_FFI_BADMM,pGVar8 + 1,
                   (ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x100 + (ulong)mm * 4) + 0x10);
  }
  uVar4 = *(uint32_t *)((long)pTVar5 - 4);
  pTVar5[-1] = *pcVar7;
  (pTVar6->u32).lo = 0;
  (pTVar6->field_2).it = uVar4;
  pTVar6[1].u32.lo = (uint32_t)L;
  pTVar1 = pTVar6 + 2;
  *(int *)((long)pTVar6 + 0xc) = ((int)pTVar1 - (int)pTVar5) + 2;
  L->top = pTVar1;
  L->base = pTVar1;
  return (int)pTVar1;
}

Assistant:

static int ffi_pairs(lua_State *L, MMS mm)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkcdata(L, 1)->ctypeid;
  CType *ct = ctype_raw(cts, id);
  cTValue *tv;
  if (ctype_isptr(ct->info)) id = ctype_cid(ct->info);
  tv = lj_ctype_meta(cts, id, mm);
  if (!tv)
    lj_err_callerv(L, LJ_ERR_FFI_BADMM, strdata(lj_ctype_repr(L, id, NULL)),
		   strdata(mmname_str(G(L), mm)));
  return lj_meta_tailcall(L, tv);
}